

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclBackend.cpp
# Opt level: O2

void __thiscall
xmrig::OclBackendPrivate::OclBackendPrivate(OclBackendPrivate *this,Controller *controller)

{
  Config *this_00;
  OclConfig *ctx;
  
  this->controller = controller;
  (this->context).m_ctx = (cl_context)0x0;
  (this->status).m_errors = 0;
  (this->status).m_started = 0;
  (this->status).m_threads = 0;
  (this->status).m_ts = 0;
  (this->platform).m_id = (cl_platform_id)0x0;
  (this->platform).m_index = 0;
  (this->devices).super__Vector_base<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->devices).super__Vector_base<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->devices).super__Vector_base<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->threads).super__Vector_base<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->threads).super__Vector_base<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->threads).super__Vector_base<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Workers<xmrig::OclLaunchData>::Workers(&this->workers);
  this_00 = Base::config(&controller->super_Base);
  ctx = Config::cl(this_00);
  init(this,(EVP_PKEY_CTX *)ctx);
  return;
}

Assistant:

inline OclBackendPrivate(Controller *controller) :
        controller(controller)
    {
        init(controller->config()->cl());
    }